

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

string * __thiscall
spvtools::val::(anonymous_namespace)::GetIdDesc_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Instruction *inst)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  string *psVar3;
  ostringstream ss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"ID <",4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"> (Op",5);
  __s = spvOpcodeString((uint)*(ushort *)(this + 0x3a));
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  psVar3 = (string *)std::ios_base::~ios_base(local_120);
  return psVar3;
}

Assistant:

std::string GetIdDesc(const Instruction& inst) {
  std::ostringstream ss;
  ss << "ID <" << inst.id() << "> (Op" << spvOpcodeString(inst.opcode()) << ")";
  return ss.str();
}